

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.c
# Opt level: O0

void read_32_rgba_8888_line(ALLEGRO_FILE *f,char *buf,char *data,int length,_Bool premul)

{
  uint32_t uVar1;
  uint uVar2;
  long lVar3;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  byte in_R8B;
  uint32_t a;
  uint32_t pixel;
  size_t bytes_read;
  size_t bytes_wanted;
  uint32_t *data32;
  int i;
  undefined4 local_24;
  
  lVar3 = al_fread(in_RDI,in_RSI,(long)(in_ECX << 2));
  memset((void *)(in_RSI + lVar3),0,(in_ECX << 2) - lVar3);
  for (local_24 = 0; local_24 < in_ECX; local_24 = local_24 + 1) {
    uVar1 = read_32le((void *)(in_RSI + (local_24 << 2)));
    uVar2 = uVar1 & 0xff;
    *(uint32_t *)(in_RDX + (long)local_24 * 4) =
         uVar1 << 0x18 | (uVar1 & 0xff00) << 8 | (uVar1 & 0xff0000) >> 8 | uVar1 >> 0x18;
    if (((in_R8B & 1) != 0) && (uVar2 != 0xff)) {
      *(char *)(in_RDX + (local_24 << 2)) =
           (char)((ulong)((int)*(char *)(in_RDX + (local_24 << 2)) * uVar2) / 0xff);
      *(char *)(in_RDX + (local_24 * 4 + 1)) =
           (char)((ulong)((int)*(char *)(in_RDX + (local_24 * 4 + 1)) * uVar2) / 0xff);
      *(char *)(in_RDX + (local_24 * 4 + 2)) =
           (char)((ulong)((int)*(char *)(in_RDX + (local_24 * 4 + 2)) * uVar2) / 0xff);
    }
  }
  return;
}

Assistant:

static void read_32_rgba_8888_line(ALLEGRO_FILE *f, char *buf, char *data,
   int length, bool premul)
{
   int i;
   uint32_t *data32 = (uint32_t *)data;
   size_t bytes_wanted = length * 4;

   size_t bytes_read = al_fread(f, buf, bytes_wanted);
   memset(buf + bytes_read, 0, bytes_wanted - bytes_read);

   for (i = 0; i < length; i++) {
      uint32_t pixel = read_32le(buf + i*4);
      uint32_t a = (pixel & 0x000000FFU);
      data32[i] = ALLEGRO_CONVERT_RGBA_8888_TO_ABGR_8888_LE(pixel);

      if (premul && a != 255) {
         data[i*4]   = data[i*4] * a / 255;
         data[i*4+1] = data[i*4+1] * a / 255;
         data[i*4+2] = data[i*4+2] * a / 255;
      }
   }
}